

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O2

void brotli::CreateHuffmanTree(uint32_t *data,size_t length,int tree_limit,uint8_t *depth)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  HuffmanTree local_88;
  int local_7c;
  vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> tree;
  
  uVar11 = 1;
  local_7c = tree_limit;
  while( true ) {
    tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::reserve
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
               &tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>,
               length * 2 + 1);
    sVar7 = length;
    while (sVar6 = sVar7, sVar7 = sVar6 - 1, sVar6 != 0) {
      uVar4 = data[sVar7];
      if (uVar4 != 0) {
        if (uVar4 <= uVar11) {
          uVar4 = uVar11;
        }
        local_88.index_left_ = -1;
        local_88.total_count_ = uVar4;
        local_88.index_right_or_value_ = (short)sVar6 + -1;
        std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::
        emplace_back<brotli::HuffmanTree>
                  ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                   &tree.
                    super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>,
                   &local_88);
      }
    }
    lVar8 = (long)tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar8 == 8) {
      depth[(tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start)->index_right_or_value_] = '\x01';
      std::_Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::~_Vector_base
                (&tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                );
      return;
    }
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<brotli::HuffmanTree*,std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
              ((__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
                )tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
                )tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>)
               0x175fb3);
    local_88.total_count_ = 0xffffffff;
    local_88.index_left_ = -1;
    local_88.index_right_or_value_ = -1;
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
               &tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>,
               &local_88);
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
               &tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>,
               &local_88);
    lVar13 = lVar8 >> 3;
    lVar12 = lVar13 + 1;
    lVar9 = 0;
    while (lVar13 = lVar13 + -1, lVar13 != 0) {
      uVar2 = tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9].total_count_;
      uVar4 = tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar12].total_count_;
      lVar5 = lVar9;
      if (uVar4 < uVar2) {
        lVar5 = lVar12;
      }
      lVar9 = lVar9 + (ulong)(uVar2 <= uVar4);
      lVar12 = lVar12 + (ulong)(uVar4 < uVar2);
      uVar2 = tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9].total_count_;
      uVar4 = tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar12].total_count_;
      lVar10 = lVar9;
      if (uVar4 < uVar2) {
        lVar10 = lVar12;
      }
      lVar9 = lVar9 + (ulong)(uVar2 <= uVar4);
      lVar12 = lVar12 + (ulong)(uVar4 < uVar2);
      tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].total_count_ =
           tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar10].total_count_ +
           tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar5].total_count_;
      tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].index_left_ = (int16_t)lVar5;
      tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].index_right_or_value_ = (int16_t)lVar10;
      std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
                ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                 &tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                 ,&local_88);
    }
    if ((long)tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != (lVar8 >> 2 | 1U)) break;
    SetDepth(tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start + ((lVar8 >> 2) - 1),
             tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start,depth,'\0');
    pbVar3 = std::__max_element<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>
                       (depth,depth + length);
    bVar1 = *pbVar3;
    std::_Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::~_Vector_base
              (&tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>);
    uVar11 = uVar11 * 2;
    if ((int)(uint)bVar1 <= local_7c) {
      return;
    }
  }
  __assert_fail("tree.size() == 2 * n + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/entropy_encode.cc"
                ,0x76,
                "void brotli::CreateHuffmanTree(const uint32_t *, const size_t, const int, uint8_t *)"
               );
}

Assistant:

void CreateHuffmanTree(const uint32_t *data,
                       const size_t length,
                       const int tree_limit,
                       uint8_t *depth) {
  // For block sizes below 64 kB, we never need to do a second iteration
  // of this loop. Probably all of our block sizes will be smaller than
  // that, so this loop is mostly of academic interest. If we actually
  // would need this, we would be better off with the Katajainen algorithm.
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    std::vector<HuffmanTree> tree;
    tree.reserve(2 * length + 1);

    for (size_t i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = std::max(data[i], count_limit);
        tree.push_back(HuffmanTree(count, -1, static_cast<int16_t>(i)));
      }
    }

    const size_t n = tree.size();
    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;      // Only one element.
      break;
    }

    std::stable_sort(tree.begin(), tree.end(), SortHuffmanTree);

    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<uint32_t>::max(), -1, -1);
    tree.push_back(sentinel);
    tree.push_back(sentinel);

    size_t i = 0;      // Points to the next leaf node.
    size_t j = n + 1;  // Points to the next non-leaf node.
    for (size_t k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      // The sentinel node becomes the parent node.
      size_t j_end = tree.size() - 1;
      tree[j_end].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      tree[j_end].index_left_ = static_cast<int16_t>(left);
      tree[j_end].index_right_or_value_ = static_cast<int16_t>(right);

      // Add back the last sentinel node.
      tree.push_back(sentinel);
    }
    assert(tree.size() == 2 * n + 1);
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);

    // We need to pack the Huffman tree in tree_limit bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (*std::max_element(&depth[0], &depth[length]) <= tree_limit) {
      break;
    }
  }
}